

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt4SubClampPalCommand::Execute
          (DrawColumnRt4SubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar6 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar12 = thread->pass_end_y - iVar1;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar6 < iVar12) {
    iVar12 = iVar6;
  }
  uVar8 = thread->pass_start_y - iVar1;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar6 = thread->num_cores;
  iVar9 = (iVar6 - (int)((iVar1 + uVar8) - thread->core) % iVar6) % iVar6;
  iVar12 = (int)((~uVar8 + iVar6 + iVar12) - iVar9) / iVar6;
  if (0 < iVar12) {
    puVar2 = (this->super_PalRtCommand)._srcblend;
    puVar3 = (this->super_PalRtCommand)._destblend;
    iVar9 = iVar1 + uVar8 + iVar9;
    iVar7 = iVar9 / iVar6 << 2;
    puVar4 = thread->dc_temp;
    iVar1 = (this->super_PalRtCommand)._pitch;
    puVar5 = (this->super_PalRtCommand)._colormap;
    pbVar10 = (this->super_PalRtCommand)._destorg +
              (long)((this->super_PalRtCommand).sx + (&ylookup)[iVar9]) + 3;
    lVar11 = 0;
    do {
      uVar8 = (puVar2[puVar5[puVar4[lVar11 * 4 + (long)iVar7]]] | 0x40100400) - puVar3[pbVar10[-3]];
      uVar13 = uVar8 & 0x40100400;
      uVar8 = uVar13 - (uVar13 >> 5) & uVar8 | 0x1f07c1f;
      pbVar10[-3] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = (puVar2[puVar5[puVar4[lVar11 * 4 + (long)iVar7 + 1]]] | 0x40100400) -
              puVar3[pbVar10[-2]];
      uVar13 = uVar8 & 0x40100400;
      uVar8 = uVar13 - (uVar13 >> 5) & uVar8 | 0x1f07c1f;
      pbVar10[-2] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = (puVar2[puVar5[puVar4[lVar11 * 4 + (long)iVar7 + 2]]] | 0x40100400) -
              puVar3[pbVar10[-1]];
      uVar13 = uVar8 & 0x40100400;
      uVar8 = uVar13 - (uVar13 >> 5) & uVar8 | 0x1f07c1f;
      pbVar10[-1] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = (puVar2[puVar5[puVar4[lVar11 * 4 + (long)iVar7 + 3]]] | 0x40100400) - puVar3[*pbVar10]
      ;
      uVar13 = uVar8 & 0x40100400;
      uVar8 = uVar13 - (uVar13 >> 5) & uVar8 | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar8 >> 0xf & uVar8];
      lVar11 = lVar11 + 1;
      pbVar10 = pbVar10 + iVar6 * iVar1;
    } while (iVar12 != (int)lVar11);
  }
  return;
}

Assistant:

void DrawColumnRt4SubClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t a = (fg2rgb[colormap[source[0]]] | 0x40100400) - bg2rgb[dest[0]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[0] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[1]]] | 0x40100400) - bg2rgb[dest[1]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[1] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[2]]] | 0x40100400) - bg2rgb[dest[2]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[2] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[3]]] | 0x40100400) - bg2rgb[dest[3]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[3] = RGB32k.All[(a>>15) & a];

			source += 4;
			dest += pitch;
		} while (--count);
	}